

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::MultiPartOutputFile::Data::headerNameUniquenessCheck
          (Data *this,vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *headers)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  iterator this_00;
  undefined8 uVar4;
  vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *in_RSI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  size_t i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff58;
  value_type *in_stack_ffffffffffffff68;
  _Self local_68 [3];
  _Self local_50;
  ulong local_48;
  vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *local_10;
  
  local_10 = in_RSI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x154b81);
  local_48 = 0;
  while( true ) {
    uVar1 = local_48;
    sVar3 = std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::size(local_10);
    if (sVar3 <= uVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x154cee);
      return;
    }
    std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[](local_10,local_48);
    Header::name_abi_cxx11_((Header *)0x154bcc);
    this_00 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(in_stack_ffffffffffffff58._M_node,
                     (key_type *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    local_50._M_node = this_00._M_node;
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_ffffffffffffff48);
    bVar2 = std::operator!=(&local_50,local_68);
    if (bVar2) break;
    std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[](local_10,local_48);
    Header::name_abi_cxx11_((Header *)0x154c9e);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00._M_node,in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff58 = pVar5.first._M_node;
    in_stack_ffffffffffffff57 = pVar5.second;
    local_48 = local_48 + 1;
  }
  uVar4 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc
            ((ArgExc *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (char *)in_stack_ffffffffffffff48);
  __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
MultiPartOutputFile::Data::headerNameUniquenessCheck (
    const vector<Header>& headers)
{
    set<string> names;
    for (size_t i = 0; i < headers.size (); i++)
    {
        if (names.find (headers[i].name ()) != names.end ())
            throw IEX_NAMESPACE::ArgExc (
                "Each part should have a unique name.");
        names.insert (headers[i].name ());
    }
}